

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O3

char * read_map(fastObjData *data,char *ptr,fastObjTexture *map)

{
  byte bVar1;
  char *__dest;
  char *pcVar2;
  char *pcVar3;
  size_t __n;
  
  do {
    bVar1 = *ptr;
    if (bVar1 < 0x20) {
      if ((bVar1 != 9) && (bVar1 != 0xd)) goto LAB_00143972;
    }
    else if (bVar1 != 0x20) {
      if (bVar1 == 0x2d) {
        return (char *)(byte *)ptr;
      }
LAB_00143972:
      __n = 0;
      while ((0xd < bVar1 || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0))) {
        bVar1 = ((byte *)ptr)[__n + 1];
        __n = __n + 1;
      }
      __dest = (char *)malloc(__n + 1);
      if (__dest != (char *)0x0) {
        memcpy(__dest,ptr,__n);
        __dest[__n] = '\0';
      }
      pcVar2 = string_concat(data->base,ptr,(char *)((byte *)ptr + __n));
      pcVar3 = pcVar2;
      do {
        if (*pcVar3 == '\\') {
          *pcVar3 = '/';
        }
        else if (*pcVar3 == '\0') {
          map->name = __dest;
          map->path = pcVar2;
          return (char *)((byte *)ptr + __n);
        }
        pcVar3 = pcVar3 + 1;
      } while( true );
    }
    ptr = (char *)((byte *)ptr + 1);
  } while( true );
}

Assistant:

static
const char* read_map(fastObjData* data, const char* ptr, fastObjTexture* map)
{
   const char* s;
   const char* e;
   char*       name;
   char*       path;

   ptr = skip_whitespace(ptr);

   /* Don't support options at present */
   if (*ptr == '-')
       return ptr;


   /* Read name */
   s = ptr;
   while (!is_end_of_name(*ptr))
       ptr++;

   e = ptr;

   name = string_copy(s, e);

   path = string_concat(data->base, s, e);
   string_fix_separators(path);

   map->name = name;
   map->path = path;

   return e;
}